

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O1

void set_col_as_taken<InputData<float,long>>
               (vector<bool,_std::allocator<bool>_> *col_is_taken,
               robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *col_is_taken_s,InputData<float,_long> *input_data,size_t col_num,ColType col_type)

{
  ulong *puVar1;
  _Bit_type *p_Var2;
  size_t sVar3;
  ulong uVar4;
  ulong local_8;
  
  if (col_type == Numeric) {
    sVar3 = 0;
  }
  else {
    sVar3 = input_data->ncols_numeric;
  }
  local_8 = sVar3 + col_num;
  p_Var2 = (col_is_taken->super__Bvector_base<std::allocator<bool>_>)._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  if ((p_Var2 == (col_is_taken->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
     ((col_is_taken->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset == 0)) {
    tsl::detail_robin_hash::
    robin_hash<unsigned_long,tsl::robin_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>,false,tsl::rh::power_of_two_growth_policy<2ul>>
    ::insert_impl<unsigned_long,unsigned_long_const&>
              ((robin_hash<unsigned_long,tsl::robin_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                *)col_is_taken_s,&local_8,&local_8);
  }
  else {
    uVar4 = local_8 + 0x3f;
    if (-1 < (long)local_8) {
      uVar4 = local_8;
    }
    puVar1 = p_Var2 + ((long)uVar4 >> 6) +
                      ((ulong)((local_8 & 0x800000000000003f) < 0x8000000000000001) - 1);
    *puVar1 = *puVar1 | 1L << ((byte)local_8 & 0x3f);
  }
  return;
}

Assistant:

void set_col_as_taken(std::vector<bool> &col_is_taken, hashed_set<size_t> &col_is_taken_s,
                      InputData &input_data, size_t col_num, ColType col_type)
{
    col_num += ((col_type == Numeric)? 0 : input_data.ncols_numeric);
    if (!col_is_taken.empty())
        col_is_taken[col_num] = true;
    else
        col_is_taken_s.insert(col_num);
}